

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filemgr.cc
# Opt level: O0

char * filemgr_redirect_old_file
                 (filemgr *very_old_file,filemgr *new_file,
                 filemgr_redirect_hdr_func *redirect_header_func)

{
  ushort uVar1;
  filemgr *pfVar2;
  size_t sVar3;
  size_t sVar4;
  void *pvVar5;
  code *in_RDX;
  undefined8 *in_RSI;
  long in_RDI;
  filemgr *new_file_of_very_old_file;
  char *past_filename;
  uint16_t new_filename_len;
  size_t new_header_len;
  size_t old_header_len;
  char *in_stack_ffffffffffffffa8;
  char *in_stack_ffffffffffffffb0;
  filemgr *file;
  char *local_8;
  
  if ((in_RDI == 0) || (in_RSI == (undefined8 *)0x0)) {
    local_8 = (char *)0x0;
  }
  else {
    pthread_spin_lock((pthread_spinlock_t *)(in_RDI + 0x1a0));
    pfVar2 = filemgr_get_instance(in_stack_ffffffffffffffb0);
    if ((*(short *)(in_RDI + 0x50) == 0) || (pfVar2 == (filemgr *)0x0)) {
      pthread_spin_unlock((pthread_spinlock_t *)(in_RDI + 0x1a0));
      local_8 = (char *)0x0;
    }
    else {
      uVar1 = *(ushort *)(in_RDI + 0x50);
      sVar3 = strlen((char *)*in_RSI);
      file = (filemgr *)(ulong)uVar1;
      sVar4 = strlen(pfVar2->filename);
      pfVar2 = (filemgr *)((long)file + ((sVar3 & 0xffff) - sVar4));
      if ((filemgr *)(ulong)uVar1 < pfVar2) {
        pvVar5 = realloc(*(void **)(in_RDI + 0xe0),(ulong)*(uint *)(in_RSI + 2));
        *(void **)(in_RDI + 0xe0) = pvVar5;
      }
      assign_new_filename(file,in_stack_ffffffffffffffa8);
      local_8 = (char *)(*in_RDX)(in_RDI,*(undefined8 *)(in_RDI + 0xe0),in_RSI);
      *(short *)(in_RDI + 0x50) = (short)pfVar2;
      *(long *)(in_RDI + 0x58) = *(long *)(in_RDI + 0x58) + 1;
      pthread_spin_unlock((pthread_spinlock_t *)(in_RDI + 0x1a0));
    }
  }
  return local_8;
}

Assistant:

char *filemgr_redirect_old_file(struct filemgr *very_old_file,
                                struct filemgr *new_file,
                                filemgr_redirect_hdr_func
                                redirect_header_func) {
    if (!very_old_file || !new_file) {
        return NULL;
    }

    size_t old_header_len, new_header_len;
    uint16_t new_filename_len;
    char *past_filename;
    spin_lock(&very_old_file->lock);

    struct filemgr *new_file_of_very_old_file =
        filemgr_get_instance(very_old_file->new_filename);

    if (very_old_file->header.size == 0 || !new_file_of_very_old_file) {
        spin_unlock(&very_old_file->lock);
        return NULL;
    }

    old_header_len = very_old_file->header.size;
    new_filename_len = strlen(new_file->filename);
    // Find out the new DB header length with new_file's filename
    new_header_len = old_header_len
                     - strlen(new_file_of_very_old_file->filename)
                     + new_filename_len;
    // As we are going to change the new_filename field in the DB header of the
    // very_old_file, maybe reallocate DB header buf to accomodate bigger value
    if (new_header_len > old_header_len) {
        very_old_file->header.data = realloc(very_old_file->header.data,
                                             new_file->blocksize);
    }
    // Re-direct very_old_file to new_file
    assign_new_filename(very_old_file, new_file->filename);
    // Note that the old_filename of the new_file is not updated, this
    // is so that every file in the history is reachable from the current file.

    past_filename = redirect_header_func(very_old_file,
                                         (uint8_t *)very_old_file->header.data,
                                         new_file);//Update in-memory header
    very_old_file->header.size = new_header_len;
    ++(very_old_file->header.revnum);

    spin_unlock(&very_old_file->lock);
    return past_filename;
}